

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O2

void __thiscall cinatra::coro_http_client::reset(coro_http_client *this)

{
  basic_streambuf<std::allocator<char>_> *pbVar1;
  element_type *this_00;
  error_code ec;
  int local_80 [2];
  long *local_78;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
  local_70;
  
  if (((((this->socket_).
         super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
       ->has_closed_)._M_base._M_i & 1U) == 0) {
    close_socket((this->socket_).
                 super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
  }
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket<asio::io_context>
            ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)&local_70,
             (io_context *)((this->executor_wrapper_).executor_.target_ & 0xfffffffffffffffc),0);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  operator=((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
             *)(this->socket_).
               super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_70);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&local_70);
  this_00 = (this->socket_).
            super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
         *)&this_00->impl_)->implementation_).super_base_implementation_type.socket_ == -1) {
    local_80[0] = 0;
    local_78 = (long *)std::_V2::system_category();
    local_70.service_._0_4_ = 2;
    asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::open
              ((basic_socket<asio::ip::tcp,_asio::any_io_executor> *)this_00,(char *)&local_70,
               (int)local_80);
    if (local_80[0] != 0) {
      (**(code **)(*local_78 + 0x20))(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      return;
    }
    this_00 = (this->socket_).
              super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  }
  LOCK();
  (this_00->has_closed_)._M_base._M_i = true;
  UNLOCK();
  pbVar1 = this->head_buf_;
  asio::basic_streambuf<std::allocator<char>_>::consume
            (pbVar1,*(long *)&pbVar1->field_0x28 - *(long *)&pbVar1->field_0x10);
  pbVar1 = this->chunked_buf_;
  asio::basic_streambuf<std::allocator<char>_>::consume
            (pbVar1,*(long *)&pbVar1->field_0x28 - *(long *)&pbVar1->field_0x10);
  (this->resp_chunk_str_)._M_string_length = 0;
  *(this->resp_chunk_str_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void reset() {
    if (!has_closed()) {
      close_socket(*socket_);
    }

    socket_->impl_ = asio::ip::tcp::socket{executor_wrapper_.context()};
    if (!socket_->impl_.is_open()) {
      std::error_code ec;
      socket_->impl_.open(asio::ip::tcp::v4(), ec);
      if (ec) {
        CINATRA_LOG_WARNING << "client reset socket failed, reason: "
                            << ec.message();
        return;
      }
    }

    socket_->has_closed_ = true;
#ifdef CINATRA_ENABLE_SSL
    need_set_sni_host_ = true;
    if (has_init_ssl_) {
      socket_->ssl_stream_ = nullptr;
      socket_->ssl_stream_ =
          std::make_unique<asio::ssl::stream<asio::ip::tcp::socket &>>(
              socket_->impl_, *ssl_ctx_);
      has_init_ssl_ = false;
    }
#endif
#ifdef BENCHMARK_TEST
    total_len_ = 0;
#endif

    // clear
    head_buf_.consume(head_buf_.size());
    chunked_buf_.consume(chunked_buf_.size());
    resp_chunk_str_.clear();
  }